

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O3

Graph * __thiscall Graph::add(Graph *this,double d)

{
  Matrix local_110;
  
  Matrix::transpose(&this->super_Matrix);
  Matrix::operator[](&local_110,&this->super_Matrix,1);
  Matrix::add(&local_110,d);
  Matrix::~Matrix(&local_110);
  Matrix::transpose(&this->super_Matrix);
  return this;
}

Assistant:

Graph& add( double d ) {
		transpose();
		operator[](1).add(d);
		transpose();
		return *this;
	}